

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg.c
# Opt level: O0

void ogg_page_init(ogg_page_t *page)

{
  ogg_page_t *page_local;
  
  if (page == (ogg_page_t *)0x0) {
    __assert_fail("page != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/ogg.c",0x16,
                  "void ogg_page_init(ogg_page_t *)");
  }
  (page->raw).size = 0;
  (page->raw).data = (uchar *)0x0;
  page->page_segments = '\0';
  page->page_no = 0;
  page->stream = 0;
  page->page_cksum = 0;
  buf_alloc(&page->raw,4000);
  if ((page->raw).data != (uchar *)0x0) {
    page->size = 0;
    return;
  }
  __assert_fail("page->raw.data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/ogg.c",0x20,
                "void ogg_page_init(ogg_page_t *)");
}

Assistant:

void ogg_page_init(ogg_page_t *page) {
  assert(page != NULL);
  
  page->raw.size = 0;
  page->raw.data = NULL;
  page->page_segments = 0;
  page->page_no = 0;
  page->stream = 0;
  page->page_cksum = 0;
  
  buf_alloc(&page->raw, 4000);
  assert(page->raw.data != NULL);
  
  page->size = 0;
}